

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

AtomicFence * __thiscall MixedArena::alloc<wasm::AtomicFence>(MixedArena *this)

{
  AtomicFence *pAVar1;
  
  pAVar1 = (AtomicFence *)allocSpace(this,0x18,8);
  *(undefined8 *)&pAVar1->order = 0;
  *(undefined8 *)&(pAVar1->super_SpecificExpression<(wasm::Expression::Id)28>).super_Expression = 0;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)28>).super_Expression.type.id = 0;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)28>).super_Expression._id = AtomicFenceId;
  return pAVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }